

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testLabelTypeMismatchTest(void)

{
  bool bVar1;
  TypeUnion TVar2;
  UniformWeighting *this;
  NearestNeighborsIndex *this_00;
  SquaredEuclideanDistance *this_01;
  SingleKdTreeIndex *this_02;
  ostream *poVar3;
  Int64Vector *this_03;
  int iVar4;
  Result res;
  Model m1;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  pointer local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  CoreML::KNNValidatorTests::generateInterface(&local_50);
  if (local_50._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    local_50.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_50.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (local_50.Type_.knearestneighborsclassifier_,3,true);
  if (((TVar2.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (TVar2.knearestneighborsclassifier_);
    ((TVar2.supportvectorclassifier_)->rho_).total_size_ = 200;
    this = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_ + 1))->
    uniformweighting_ = this;
  }
  this_00 = (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_00 == (NearestNeighborsIndex *)0x0) {
    this_00 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(this_00);
    (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_ = this_00;
  }
  if (this_00->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_00);
    this_00->_oneof_case_[1] = 200;
    this_01 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_01);
    (this_00->DistanceFunction_).squaredeuclideandistance_ = this_01;
  }
  if (this_00->_oneof_case_[0] == 0x6e) {
    this_02 = (SingleKdTreeIndex *)(this_00->IndexType_).linearindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_00);
    this_00->_oneof_case_[0] = 0x6e;
    this_02 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_02);
    (this_00->IndexType_).singlekdtreeindex_ = this_02;
  }
  this_02->leafsize_ = 0x1e;
  CoreML::validate<(MLModelType)404>((Result *)&local_78,&local_50);
  bVar1 = CoreML::Result::good((Result *)&local_78);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x19f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  else {
    if ((TVar2.pipeline_)->_cached_size_ != 0x6e) {
      CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
                (TVar2.knearestneighborsclassifier_);
      (TVar2.pipeline_)->_cached_size_ = 0x6e;
      ((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_)->defaultint64label_ =
           (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    local_a0 = (undefined1  [8])local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Default","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&((DefaultClassLabelUnion *)
                &(TVar2.bayesianprobitregressor_)->regressioninputfeaturename_)->defaultstringlabel_
               ,(string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (string *)local_a0);
    if (local_a0 != (undefined1  [8])local_90) {
      operator_delete((void *)local_a0,local_90._0_8_ + 1);
    }
    CoreML::validate<(MLModelType)404>((Result *)local_a0,&local_50);
    local_78 = (pointer)local_a0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
    if (local_98._M_p != local_90 + 8) {
      operator_delete(local_98._M_p,local_90._8_8_ + 1);
    }
    bVar1 = CoreML::Result::good((Result *)&local_78);
    if (bVar1) {
      if ((TVar2.glmregressor_)->postevaluationtransform_ != 0x65) {
        CoreML::Specification::KNearestNeighborsClassifier::clear_ClassLabels
                  (TVar2.knearestneighborsclassifier_);
        (TVar2.glmregressor_)->postevaluationtransform_ = 0x65;
        this_03 = (Int64Vector *)operator_new(0x28);
        CoreML::Specification::Int64Vector::Int64Vector(this_03);
        ((ClassLabelsUnion *)&((TVar2.pipeline_)->models_).super_RepeatedPtrFieldBase.rep_)->
        int64classlabels_ = this_03;
      }
      CoreML::validate<(MLModelType)404>((Result *)local_a0,&local_50);
      local_78 = (pointer)local_a0;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
      if (local_98._M_p != local_90 + 8) {
        operator_delete(local_98._M_p,local_90._8_8_ + 1);
      }
      bVar1 = CoreML::Result::good((Result *)&local_78);
      iVar4 = 0;
      if (!bVar1) goto LAB_00148171;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1ab);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1a5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
  }
  std::ostream::put((char)poVar3);
  iVar4 = 1;
  std::ostream::flush();
LAB_00148171:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return iVar4;
}

Assistant:

int testLabelTypeMismatchTest() {
    
    Specification::Model m1;
    
    KNNValidatorTests::generateInterface(m1);
    
    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    
    // Validation should fail since we are not telling the label type.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    knnClassifier->set_defaultstringlabel("Default");
    
    // Validation should pass now.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);
    
    knnClassifier->mutable_int64classlabels();
    
    // Validation should fail due to mismatch in type
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    return 0;
    
}